

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_PianoWidget.cpp
# Opt level: O0

void PianoWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  int *result;
  PianoWidget *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == InvokeMetaMethod) {
    if (_id == 0) {
      keyDown((PianoWidget *)_o,*_a[1]);
    }
    else if (_id == 1) {
      keyChange((PianoWidget *)_o,*_a[1]);
    }
    else if (_id == 2) {
      keyUp((PianoWidget *)_o);
    }
  }
  else if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    if (pcVar2 == keyDown && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *puVar1 = 0;
    }
    else {
      pcVar2 = *_a[1];
      if (pcVar2 == keyChange && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
        *puVar1 = 1;
      }
      else {
        pcVar2 = *_a[1];
        if (pcVar2 == keyUp && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
          *puVar1 = 2;
        }
      }
    }
  }
  return;
}

Assistant:

void PianoWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<PianoWidget *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->keyDown((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->keyChange((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->keyUp(); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (PianoWidget::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PianoWidget::keyDown)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (PianoWidget::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PianoWidget::keyChange)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (PianoWidget::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PianoWidget::keyUp)) {
                *result = 2;
                return;
            }
        }
    }
}